

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O0

void __thiscall ir_tree_visitor::visit(ir_tree_visitor *this,OrExpr *ptr)

{
  SubtreeWrapper *first_00;
  SubtreeWrapper *second_00;
  OrConditionalWrapper *this_00;
  SubtreeWrapper *second;
  SubtreeWrapper *first;
  OrExpr *ptr_local;
  ir_tree_visitor *this_local;
  
  (**(ptr->first->super_Base)._vptr_Base)();
  first_00 = this->curr_wrapper;
  (**(ptr->second->super_Base)._vptr_Base)();
  second_00 = this->curr_wrapper;
  this_00 = (OrConditionalWrapper *)operator_new(0x18);
  IRT::OrConditionalWrapper::OrConditionalWrapper(this_00,first_00,second_00);
  this->curr_wrapper = (SubtreeWrapper *)this_00;
  return;
}

Assistant:

void ir_tree_visitor::visit(OrExpr* ptr) {
    ptr->first->accept(this);
    auto first = curr_wrapper;
    ptr->second->accept(this);
    auto second = curr_wrapper;

    curr_wrapper = new IRT::OrConditionalWrapper(
        first,
        second
    );
}